

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
parser::memo::any::bind<std::__cxx11::string>
          (any *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  type_info *this_00;
  
  if (this->p == (dyn *)0x0) {
    this_00 = (type_info *)&void::typeinfo;
  }
  else {
    iVar2 = (*this->p->_vptr_dyn[2])();
    this_00 = (type_info *)CONCAT44(extraout_var,iVar2);
  }
  bVar1 = std::type_info::operator==(this_00,(type_info *)&std::__cxx11::string::typeinfo);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)v);
    return;
  }
  return;
}

Assistant:

void bind(T& v) {
				if ( type() == typeid(T) ) {
					v = static_cast<of<T>*>(p)->v;
				}
			}